

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zz_etc.c
# Opt level: O1

bool_t zzSqrt(word *b,word *a,size_t n,void *stack)

{
  long lVar1;
  int iVar2;
  bool_t bVar3;
  size_t n_00;
  size_t sVar4;
  word wVar5;
  word *r;
  size_t n_01;
  
  n_01 = n + 1 >> 1;
  n_00 = wwWordSize(a,n);
  if (n_00 == 0) {
    wwSetZero(b,n_01);
    bVar3 = 1;
  }
  else {
    lVar1 = n_01 * 0x10;
    r = (word *)((long)stack + n_01 * 8 + 8);
    wwSetZero((word *)stack,n_01 + 1);
    sVar4 = wwBitSize(a,n_00);
    wwSetBit((word *)stack,sVar4 + 1 >> 1,1);
    zzSubW2((word *)stack,n_01 + 1,1);
    while( true ) {
      wwCopy(b,(word *)stack,n_01);
      n_01 = wwWordSize(b,n_01);
      zzDiv((word *)stack,r,a,n_00,b,n_01,(void *)((long)stack + lVar1 + 8));
      if ((n_00 == n_01 * 2) && (*(long *)((long)stack + n_01 * 8) != 0)) break;
      iVar2 = wwCmp(b,(word *)stack,n_01);
      if (iVar2 == 0) {
        bVar3 = wwIsZero(r,n_01);
        return bVar3;
      }
      if (iVar2 < 0) break;
      wVar5 = zzAdd2((word *)stack,b,n_01);
      *(word *)((long)stack + n_01 * 8) = wVar5;
      wwShLo((word *)stack,n_01 + 1,1);
    }
    bVar3 = 0;
  }
  return bVar3;
}

Assistant:

bool_t zzSqrt(word b[], const word a[], size_t n, void* stack)
{
	register int cmp;
	size_t m = (n + 1) / 2;
	word* t = (word*)stack;
	word* r = t + m + 1;
	stack = r + m;
	// pre
	ASSERT(wwIsDisjoint2(a, n, b, m));
	// нормализовать a и обработать a == 0
	if ((n = wwWordSize(a, n)) == 0)
	{
		wwSetZero(b, m);
		return TRUE;
	}
	// t <- 2^{(len(a) + 1) / 2} - 1 (умещается в m слов)
	wwSetZero(t, m + 1);
	wwSetBit(t, (wwBitSize(a, n) + 1) / 2, 1);
	zzSubW2(t, m + 1, 1);
	ASSERT(t[m] == 0);
	// итерации
	while (1)
	{
		// b <- t
		wwCopy(b, t, m);
		m = wwWordSize(b, m);
		// t <- a / b
		zzDiv(t, r, a, n, b, m, stack);
		// частное [n - m + 1]t включает ненулевое слово t[m] => t > b
		if (n - m == m && t[m] > 0)
			return FALSE;
		// сравнить [m]b и [m]t
		cmp = wwCmp(b, t, m);
		// b == t => a -- полный квадрат <=> r == 0
		if (cmp == 0)
			return wwIsZero(r, m);
		// b < t => выход, a -- не полный квадрат
		if (cmp < 0)
			break;
		// t <- (b + t) / 2
		t[m] = zzAdd2(t, b, m);
		wwShLo(t, m + 1, 1);
		ASSERT(t[m] == 0);
	}
	return FALSE;
}